

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::add(UnicodeSet *this,UnicodeString *s)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t cp;
  UnicodeString *s_local;
  UnicodeSet *this_local;
  
  iVar2 = UnicodeString::length(s);
  if (((iVar2 != 0) && (UVar1 = isFrozen(this), UVar1 == '\0')) &&
     (UVar1 = isBogus(this), UVar1 == '\0')) {
    iVar2 = getSingleCP(s);
    if (iVar2 < 0) {
      UVar1 = UVector::contains(this->strings,s);
      if (UVar1 == '\0') {
        _add(this,s);
        releasePattern(this);
      }
    }
    else {
      add(this,iVar2);
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::add(const UnicodeString& s) {
    if (s.length() == 0 || isFrozen() || isBogus()) return *this;
    int32_t cp = getSingleCP(s);
    if (cp < 0) {
        if (!strings->contains((void*) &s)) {
            _add(s);
            releasePattern();
        }
    } else {
        add((UChar32)cp);
    }
    return *this;
}